

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

string * __thiscall pbrt::Curve::ToString_abi_cxx11_(string *__return_storage_ptr__,Curve *this)

{
  CurveCommon *v;
  
  v = this->common;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::CurveCommon_const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ Curve common: %s uMin: %f uMax: %f ]",v,&this->uMin,
             &this->uMax);
  return __return_storage_ptr__;
}

Assistant:

std::string Curve::ToString() const {
    return StringPrintf("[ Curve common: %s uMin: %f uMax: %f ]", *common, uMin, uMax);
}